

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar3;
  uint uVar4;
  double *pdVar5;
  uint uVar6;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar7;
  ulong uVar8;
  value_type vVar9;
  
  pFVar7 = (fadexpr->fadexpr_).left_;
  pFVar2 = (fadexpr->fadexpr_).right_;
  uVar4 = (((pFVar7->fadexpr_).right_)->dx_).num_elts;
  uVar1 = (((((pFVar2->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar6 = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar6 < (int)uVar1) {
    uVar6 = uVar1;
  }
  if ((int)uVar6 < (int)uVar4) {
    uVar6 = uVar4;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar6 == uVar1) {
    if (uVar6 == 0) goto LAB_00ddf157;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar6 == 0) {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00ddf157;
    }
    if (uVar1 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar7 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar6;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar8 = (ulong)uVar6 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar5;
    uVar4 = (((pFVar7->fadexpr_).right_)->dx_).num_elts;
  }
  if (((uVar4 == 0) ||
      (pFVar2 = (fadexpr->fadexpr_).right_,
      (((((pFVar2->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts == 0)) ||
     ((((pFVar2->fadexpr_).right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar6) {
      uVar8 = 0;
      do {
        vVar9 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar8);
        pdVar5[uVar8] = vVar9;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
  }
  else if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      vVar9 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
              ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar8);
      pdVar5[uVar8] = vVar9;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
LAB_00ddf157:
  pFVar7 = (fadexpr->fadexpr_).left_;
  pFVar2 = (fadexpr->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  this->val_ = ((double)(pFVar7->fadexpr_).left_.constant_ * ((pFVar7->fadexpr_).right_)->val_) /
               ((double)(pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_ +
               ((pFVar2->fadexpr_).right_)->val_);
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}